

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmake *this_00;
  PolicyID id_00;
  PolicyID id_01;
  string local_70;
  undefined1 local_40 [8];
  string msg;
  PolicyStatus status_local;
  PolicyID id_local;
  cmMakefile *this_local;
  
  msg.field_2._8_4_ = status;
  msg.field_2._12_4_ = id;
  if ((status == NEW) || (PVar2 = cmPolicies::GetPolicyStatus(id), PVar2 != REQUIRED_ALWAYS)) {
    if ((msg.field_2._8_4_ == 0) && ((int)msg.field_2._12_4_ < 0x44)) {
      this_00 = GetCMakeInstance(this);
      bVar1 = cmake::GetIsInTryCompile(this_00);
      if ((!bVar1) || (msg.field_2._12_4_ != 0x41)) {
        cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_
                  (&local_70,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,id_01);
        IssueMessage(this,DEPRECATION_WARNING,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    cmStateSnapshot::SetPolicy(&this->StateSnapshot,msg.field_2._12_4_,msg.field_2._8_4_);
    this_local._7_1_ = true;
  }
  else {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
              ((string *)local_40,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,id_00);
    IssueMessage(this,FATAL_ERROR,(string *)local_40);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(MessageType::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies, especially those that require a lot
  // of code to maintain the old behavior.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0067 &&
      !(this->GetCMakeInstance()->GetIsInTryCompile() &&
        (
          // Policies set by cmCoreTryCompile::TryCompileCode.
          id == cmPolicies::CMP0065))) {
    this->IssueMessage(MessageType::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}